

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

complex dja::operator/(complex *a,complex *b)

{
  float fVar1;
  float fVar2;
  complex cVar3;
  float fVar4;
  
  fVar1 = b->re;
  fVar2 = b->im;
  fVar4 = 1.0 / (fVar1 * fVar1 + fVar2 * fVar2);
  cVar3.im = fVar4 * (a->im * fVar1 - a->re * fVar2);
  cVar3.re = (a->re * fVar1 + fVar2 * a->im) * fVar4;
  return cVar3;
}

Assistant:

Z bar(const Z& z) {return Z(z.re, -z.im);}